

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O0

char * plugin_loader_generate_symbol_iface_name(char *name,char *suffix)

{
  size_t __n;
  size_t __n_00;
  char *in_RSI;
  char *in_RDI;
  char *symbol_iface_name;
  size_t suffix_length;
  size_t name_length;
  char *local_8;
  
  __n = strlen(in_RDI);
  __n_00 = strlen(in_RSI);
  local_8 = (char *)malloc(__n + __n_00 + 1);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    memcpy(local_8,in_RDI,__n);
    memcpy(local_8 + __n,in_RSI,__n_00);
    local_8[__n + __n_00] = '\0';
  }
  return local_8;
}

Assistant:

char *plugin_loader_generate_symbol_iface_name(const char *name, char *suffix)
{
	size_t name_length = strlen(name);
	size_t suffix_length = strlen(suffix);
	char *symbol_iface_name = malloc(sizeof(char) * (name_length + suffix_length + 1));

	if (symbol_iface_name == NULL)
	{
		return NULL;
	}

	memcpy(symbol_iface_name, name, name_length);

	memcpy(&symbol_iface_name[name_length], suffix, suffix_length);

	symbol_iface_name[name_length + suffix_length] = '\0';

	return symbol_iface_name;
}